

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::analysis::ForwardPointer::str_abi_cxx11_
          (string *__return_storage_ptr__,ForwardPointer *this)

{
  ostringstream oss;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"forward_pointer(",0x10);
  if (this->pointer_ == (Pointer *)0x0) {
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  }
  else {
    (*(this->pointer_->super_Type)._vptr_Type[3])(&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(char *)local_1b0,local_1a8);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0,local_1a0[0] + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ForwardPointer::str() const {
  std::ostringstream oss;
  oss << "forward_pointer(";
  if (pointer_ != nullptr) {
    oss << pointer_->str();
  } else {
    oss << target_id_;
  }
  oss << ")";
  return oss.str();
}